

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O0

void TIFFSwabArrayOfLong8(uint64_t *lp,tmsize_t n)

{
  undefined1 uVar1;
  uchar t;
  uchar *cp;
  tmsize_t n_local;
  uint64_t *lp_local;
  
  cp = (uchar *)n;
  n_local = (tmsize_t)lp;
  while (0 < (long)cp) {
    uVar1 = *(undefined1 *)(n_local + 7);
    *(undefined1 *)(n_local + 7) = *(undefined1 *)n_local;
    *(undefined1 *)n_local = uVar1;
    uVar1 = *(undefined1 *)(n_local + 6);
    *(undefined1 *)(n_local + 6) = *(undefined1 *)(n_local + 1);
    *(undefined1 *)(n_local + 1) = uVar1;
    uVar1 = *(undefined1 *)(n_local + 5);
    *(undefined1 *)(n_local + 5) = *(undefined1 *)(n_local + 2);
    *(undefined1 *)(n_local + 2) = uVar1;
    uVar1 = *(undefined1 *)(n_local + 4);
    *(undefined1 *)(n_local + 4) = *(undefined1 *)(n_local + 3);
    *(undefined1 *)(n_local + 3) = uVar1;
    n_local = n_local + 8;
    cp = cp + -1;
  }
  return;
}

Assistant:

void TIFFSwabArrayOfLong8(register uint64_t *lp, tmsize_t n)
{
    register unsigned char *cp;
    register unsigned char t;
    assert(sizeof(uint64_t) == 8);
    /* XXX unroll loop some */
    while (n-- > 0)
    {
        cp = (unsigned char *)lp;
        t = cp[7];
        cp[7] = cp[0];
        cp[0] = t;
        t = cp[6];
        cp[6] = cp[1];
        cp[1] = t;
        t = cp[5];
        cp[5] = cp[2];
        cp[2] = t;
        t = cp[4];
        cp[4] = cp[3];
        cp[3] = t;
        lp++;
    }
}